

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError WriteStream(PaStream *s,void *buffer,unsigned_long frames)

{
  undefined8 uVar1;
  long lVar2;
  PaError PVar3;
  int iVar4;
  unsigned_long numFrames;
  ulong uVar5;
  void *__dest;
  char *format;
  int xrun;
  snd_pcm_uframes_t framesGot;
  snd_pcm_uframes_t framesAvail;
  int local_5c;
  undefined8 local_58;
  unsigned_long local_50;
  PaError local_44;
  ulong local_40;
  void *local_38;
  
  uVar1 = *(undefined8 *)((long)s + 0x2c0);
  if (*(long *)((long)s + 0x340) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->playback.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4572\n"
                     );
  }
  *(undefined8 *)((long)s + 0x2c0) = 0;
  PVar3 = 0;
  if (0.0 < *(double *)((long)s + 0x278)) {
    *(undefined8 *)((long)s + 0x278) = 0;
    PVar3 = -0x26fc;
  }
  __dest = buffer;
  if (*(int *)((long)s + 0x318) == 0) {
    __dest = *(void **)((long)s + 0x368);
    memcpy(__dest,buffer,(long)*(int *)((long)s + 0x310) << 3);
  }
  local_58 = uVar1;
  local_44 = PVar3;
  if (frames != 0) {
    local_38 = __dest;
    do {
      local_5c = 0;
      paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&local_40,&local_5c);
      if (paUtilErr_ < 0) {
        format = 
        "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4596\n"
        ;
LAB_0010fc3a:
        PaUtil_DebugPrint(format);
      }
      local_50 = local_40;
      if (frames <= local_40) {
        local_50 = frames;
      }
      paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&local_50,&local_5c);
      if (paUtilErr_ < 0) {
        format = 
        "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4599\n"
        ;
        goto LAB_0010fc3a;
      }
      if (local_50 != 0) {
        numFrames = PaUtil_CopyOutput((PaUtilBufferProcessor *)((long)s + 0x68),&local_38,local_50);
        local_50 = numFrames;
        paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&local_5c);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4603\n"
          ;
          goto LAB_0010fc3a;
        }
        frames = frames - numFrames;
      }
      uVar5 = GetStreamWriteAvailable(s);
      paUtilErr_ = (PaError)uVar5;
      if (paUtilErr_ < 0) {
        format = 
        "Expression \'err = GetStreamWriteAvailable( stream )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4610\n"
        ;
        goto LAB_0010fc3a;
      }
      lVar2 = *(long *)((long)s + 0x350);
      local_40 = uVar5;
      iVar4 = snd_pcm_state(*(undefined8 *)((long)s + 0x340));
      if (((iVar4 == 2) && (*(ulong *)((long)s + 0x348) <= lVar2 - uVar5)) &&
         (iVar4 = snd_pcm_start(*(undefined8 *)((long)s + 0x340)), iVar4 < 0)) {
        WriteStream_cold_1();
        local_44 = -9999;
        break;
      }
    } while (frames != 0);
  }
  *(undefined8 *)((long)s + 0x2c0) = local_58;
  return local_44;
}

Assistant:

static PaError WriteStream( PaStream* s, const void *buffer, unsigned long frames )
{
    PaError result = paNoError;
    signed long err;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    snd_pcm_uframes_t framesGot, framesAvail;
    const void *userBuffer;
    snd_pcm_t *save = stream->capture.pcm;

    assert( stream );

    PA_UNLESS( stream->playback.pcm, paCanNotWriteToAnInputOnlyStream );

    /* Disregard capture */
    stream->capture.pcm = NULL;

    if( stream->underrun > 0. )
    {
        result = paOutputUnderflowed;
        stream->underrun = 0.0;
    }

    if( stream->playback.userInterleaved )
        userBuffer = buffer;
    else /* Copy channels into local array */
    {
        userBuffer = stream->playback.userBuffers;
        memcpy( (void *)userBuffer, buffer, sizeof (void *) * stream->playback.numUserChannels );
    }

    while( frames > 0 )
    {
        int xrun = 0;
        snd_pcm_uframes_t hwAvail;

        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        framesGot = PA_MIN( framesAvail, frames );

        PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
        if( framesGot > 0 )
        {
            framesGot = PaUtil_CopyOutput( &stream->bufferProcessor, &userBuffer, framesGot );
            PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            frames -= framesGot;
        }

        /* Start stream after one period of samples worth */

        /* Frames residing in buffer */
        PA_ENSURE( err = GetStreamWriteAvailable( stream ) );
        framesAvail = err;
        hwAvail = stream->playback.alsaBufferSize - framesAvail;

        if( alsa_snd_pcm_state( stream->playback.pcm ) == SND_PCM_STATE_PREPARED &&
                hwAvail >= stream->playback.framesPerPeriod )
        {
            ENSURE_( alsa_snd_pcm_start( stream->playback.pcm ), paUnanticipatedHostError );
        }
    }

end:
    stream->capture.pcm = save;
    return result;
error:
    goto end;
}